

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O0

SysCallInt32Result cppnet::OsHandle::Listen(int64_t sockfd,uint32_t len)

{
  SysCallInt32Result SVar1;
  int iVar2;
  int *piVar3;
  undefined4 local_1c;
  int32_t ret;
  uint32_t len_local;
  int64_t sockfd_local;
  
  local_1c = len;
  if (len == 0) {
    local_1c = 0x1000;
  }
  iVar2 = listen((int)sockfd,local_1c);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    sockfd_local._4_4_ = *piVar3;
  }
  else {
    sockfd_local._4_4_ = 0;
  }
  SVar1._errno = sockfd_local._4_4_;
  SVar1._return_value = iVar2;
  return SVar1;
}

Assistant:

SysCallInt32Result OsHandle::Listen(int64_t sockfd, uint32_t len) {
    if (len == 0) {
        len = SOMAXCONN;
    }
    
    int32_t ret = listen(sockfd, len);
    if (ret < 0) {
        return {ret, errno};
    }
    return {ret, 0};
}